

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

MatchResult __thiscall
r_exec::PGMOverlay::_match(PGMOverlay *this,View *input,uint16_t pattern_index)

{
  Atom *pAVar1;
  bool bVar2;
  short sVar3;
  uint16_t uVar4;
  int iVar5;
  MatchResult MVar6;
  Code *pCVar7;
  undefined4 extraout_var;
  View *pVVar8;
  undefined4 extraout_var_00;
  undefined1 local_100 [8];
  IPGMContext pattern_skeleton_1;
  IPGMContext input_object_1;
  MatchResult r;
  undefined1 local_88 [8];
  IPGMContext pattern_skeleton;
  IPGMContext input_object;
  uint16_t pattern_index_local;
  View *input_local;
  PGMOverlay *this_local;
  
  sVar3 = r_code::Atom::asOpcode();
  if (sVar3 == Opcodes::AntiPtn) {
    IPGMContext::GetContextFromInput
              ((IPGMContext *)&pattern_skeleton.view,input,&this->super_InputLessPGMOverlay);
    pCVar7 = Overlay::getObject((Overlay *)this);
    iVar5 = (*(pCVar7->super__Object)._vptr__Object[9])(pCVar7,0);
    pVVar8 = Overlay::getView((Overlay *)this);
    pAVar1 = (this->super_InputLessPGMOverlay).super_Overlay.code;
    uVar4 = r_code::Atom::asIndex();
    IPGMContext::IPGMContext
              ((IPGMContext *)local_88,(Code *)CONCAT44(extraout_var,iVar5),pVVar8,pAVar1,uVar4,
               &this->super_InputLessPGMOverlay,STEM);
    bVar2 = IPGMContext::match((IPGMContext *)local_88,(IPGMContext *)&pattern_skeleton.view);
    if (bVar2) {
      MVar6 = __match(this,input,pattern_index);
      if (MVar6 == SUCCESS) {
        this_local._4_4_ = FAILURE;
        bVar2 = true;
      }
      else if ((MVar6 == FAILURE) || (MVar6 == IMPOSSIBLE)) {
        this_local._4_4_ = SUCCESS;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      this_local._4_4_ = SUCCESS;
      bVar2 = true;
    }
    IPGMContext::~IPGMContext((IPGMContext *)local_88);
    IPGMContext::~IPGMContext((IPGMContext *)&pattern_skeleton.view);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  else {
    sVar3 = r_code::Atom::asOpcode();
    if (sVar3 == Opcodes::Ptn) {
      IPGMContext::GetContextFromInput
                ((IPGMContext *)&pattern_skeleton_1.view,input,&this->super_InputLessPGMOverlay);
      pCVar7 = Overlay::getObject((Overlay *)this);
      iVar5 = (*(pCVar7->super__Object)._vptr__Object[9])(pCVar7,0);
      pVVar8 = Overlay::getView((Overlay *)this);
      pAVar1 = (this->super_InputLessPGMOverlay).super_Overlay.code;
      uVar4 = r_code::Atom::asIndex();
      IPGMContext::IPGMContext
                ((IPGMContext *)local_100,(Code *)CONCAT44(extraout_var_00,iVar5),pVVar8,pAVar1,
                 uVar4,&this->super_InputLessPGMOverlay,STEM);
      bVar2 = IPGMContext::match((IPGMContext *)local_100,(IPGMContext *)&pattern_skeleton_1.view);
      if (bVar2) {
        this_local._4_4_ = __match(this,input,pattern_index);
      }
      else {
        this_local._4_4_ = IMPOSSIBLE;
      }
      IPGMContext::~IPGMContext((IPGMContext *)local_100);
      IPGMContext::~IPGMContext((IPGMContext *)&pattern_skeleton_1.view);
      return this_local._4_4_;
    }
  }
  return IMPOSSIBLE;
}

Assistant:

inline PGMOverlay::MatchResult PGMOverlay::_match(r_exec::View *input, uint16_t pattern_index)
{
    if (code[pattern_index].asOpcode() == Opcodes::AntiPtn) {
        IPGMContext input_object = IPGMContext::GetContextFromInput(input, this);
        IPGMContext pattern_skeleton(getObject()->get_reference(0), getView(), code, code[pattern_index + 1].asIndex(), this); // pgm_code[pattern_index] is the first atom of the pattern; pgm_code[pattern_index+1] is an iptr to the skeleton.

        if (!pattern_skeleton.match(input_object)) {
            return SUCCESS;
        }

        MatchResult r = __match(input, pattern_index);

        switch (r) {
        case IMPOSSIBLE:
        case FAILURE:
            return SUCCESS;

        case SUCCESS:
            return FAILURE;
        }
    } else if (code[pattern_index].asOpcode() == Opcodes::Ptn) {
        IPGMContext input_object = IPGMContext::GetContextFromInput(input, this);
        IPGMContext pattern_skeleton(getObject()->get_reference(0), getView(), code, code[pattern_index + 1].asIndex(), this); // pgm_code[pattern_index] is the first atom of the pattern; pgm_code[pattern_index+1] is an iptr to the skeleton.

        if (!pattern_skeleton.match(input_object)) {
            return IMPOSSIBLE;
        }

        return __match(input, pattern_index);
    }

    return IMPOSSIBLE;
}